

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O2

void Llb_ManPrepareVarLimits(Llb_Man_t *p)

{
  Llb_Grp_t *pLVar1;
  uint __line;
  int iVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  int iVar5;
  char *__assertion;
  int Entry;
  long lVar6;
  
  if (p->vVarBegs == (Vec_Int_t *)0x0) {
    if (p->vVarEnds == (Vec_Int_t *)0x0) {
      pVVar3 = Vec_IntStart(p->pAig->vObjs->nSize);
      p->vVarEnds = pVVar3;
      pVVar3 = Vec_IntStart(p->pAig->vObjs->nSize);
      p->vVarBegs = pVVar3;
      Vec_IntFill(pVVar3,p->pAig->vObjs->nSize,p->pMatrix->nCols);
      for (lVar6 = 0; lVar6 < p->pMatrix->nCols; lVar6 = lVar6 + 1) {
        pLVar1 = p->pMatrix->pColGrps[lVar6];
        iVar5 = 0;
        while( true ) {
          Entry = (int)lVar6;
          if (pLVar1->vIns->nSize <= iVar5) break;
          pvVar4 = Vec_PtrEntry(pLVar1->vIns,iVar5);
          iVar2 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24));
          if (lVar6 < iVar2) {
            Vec_IntWriteEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24),Entry);
          }
          iVar5 = iVar5 + 1;
        }
        for (iVar5 = 0; iVar5 < pLVar1->vOuts->nSize; iVar5 = iVar5 + 1) {
          pvVar4 = Vec_PtrEntry(pLVar1->vOuts,iVar5);
          iVar2 = Vec_IntEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24));
          if (lVar6 < iVar2) {
            Vec_IntWriteEntry(p->vVarBegs,*(int *)((long)pvVar4 + 0x24),Entry);
          }
        }
        for (iVar5 = 0; iVar5 < pLVar1->vIns->nSize; iVar5 = iVar5 + 1) {
          pvVar4 = Vec_PtrEntry(pLVar1->vIns,iVar5);
          iVar2 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
          if (iVar2 < lVar6) {
            Vec_IntWriteEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24),Entry);
          }
        }
        for (iVar5 = 0; iVar5 < pLVar1->vOuts->nSize; iVar5 = iVar5 + 1) {
          pvVar4 = Vec_PtrEntry(pLVar1->vOuts,iVar5);
          iVar2 = Vec_IntEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24));
          if (iVar2 < lVar6) {
            Vec_IntWriteEntry(p->vVarEnds,*(int *)((long)pvVar4 + 0x24),Entry);
          }
        }
      }
      return;
    }
    __assertion = "p->vVarEnds == NULL";
    __line = 0x5e;
  }
  else {
    __assertion = "p->vVarBegs == NULL";
    __line = 0x5d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Man.c"
                ,__line,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
}

Assistant:

void Llb_ManPrepareVarLimits( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k;
    assert( p->vVarBegs == NULL );
    assert( p->vVarEnds == NULL );
    p->vVarEnds = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    p->vVarBegs = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    Vec_IntFill( p->vVarBegs, Aig_ManObjNumMax(p->pAig), p->pMatrix->nCols );

    for ( i = 0; i < p->pMatrix->nCols; i++ )
    {
        pGroup = p->pMatrix->pColGrps[i];

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
    }
}